

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

void mark_live(C_Parser *parser,C_Obj *var)

{
  C_Obj *var_00;
  C_Obj *fn;
  int i;
  C_Obj *var_local;
  C_Parser *parser_local;
  
  if (((var->is_function & 1U) != 0) && ((var->is_live & 1U) == 0)) {
    var->is_live = true;
    for (fn._4_4_ = 0; fn._4_4_ < (var->refs).len; fn._4_4_ = fn._4_4_ + 1) {
      var_00 = find_func(parser,(var->refs).data[fn._4_4_]);
      if (var_00 != (C_Obj *)0x0) {
        mark_live(parser,var_00);
      }
    }
  }
  return;
}

Assistant:

static void mark_live(C_Parser *parser, C_Obj *var) {
  if (!var->is_function || var->is_live)
    return;
  var->is_live = true;

  for (int i = 0; i < var->refs.len; i++) {
    C_Obj *fn = find_func(parser, var->refs.data[i]);
    if (fn)
      mark_live(parser, fn);
  }
}